

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cc
# Opt level: O2

void * valloc(size_t __size)

{
  void *pvVar1;
  
  pvVar1 = snmalloc::libc::memalign(0x1000,__size);
  return pvVar1;
}

Assistant:

SNMALLOC_EXPORT void* SNMALLOC_NAME_MANGLE(valloc)(size_t size)
  {
    return snmalloc::libc::memalign(OS_PAGE_SIZE, size);
  }